

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_2d_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  uint8_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int16_t res;
  int32_t sum_1;
  int x_1;
  int y_1;
  int16_t *src_vert;
  int32_t sum;
  int x;
  int y;
  int16_t *im;
  int bd;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int local_8b60;
  int local_8b5c;
  undefined1 *local_8b58;
  int local_8b48;
  int local_8b44;
  undefined1 *local_8b40;
  undefined1 local_8b28 [35588];
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_8;
  
  local_8b40 = local_8b28;
  local_8 = in_RDI;
  for (local_8b44 = 0; local_8b44 < in_R9D + 1; local_8b44 = local_8b44 + 1) {
    for (local_8b48 = 0; local_8b48 < in_R8D; local_8b48 = local_8b48 + 1) {
      *(ushort *)(local_8b40 + (long)local_8b48 * 2) =
           *(byte *)(local_8 + local_8b48) + 0x100 + (ushort)*(byte *)(local_8 + (local_8b48 + 1));
    }
    local_8 = local_8 + in_ESI;
    local_8b40 = local_8b40 + (long)in_R8D * 2;
  }
  local_8b58 = local_8b28;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (local_8b5c = 0; local_8b5c < local_24; local_8b5c = local_8b5c + 1) {
    for (local_8b60 = 0; local_8b60 < local_20; local_8b60 = local_8b60 + 1) {
      uVar1 = clip_pixel((int)(short)((short)((int)*(short *)(local_8b58 + (long)local_8b60 * 2) +
                                              (int)*(short *)(local_8b58 +
                                                             (long)(in_R8D + local_8b60) * 2) +
                                              0x402 >> 2) + -0x180));
      *(uint8_t *)(local_18 + local_8b60) = uVar1;
    }
    local_8b58 = local_8b58 + (long)in_R8D * 2;
    local_18 = local_18 + local_1c;
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_intrabc_c(const uint8_t *src, int src_stride,
                                  uint8_t *dst, int dst_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int bd = 8;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum = (1 << bd) + src[x] + src[x + 1];
      assert(0 <= sum && sum < (1 << (bd + 2)));
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << (bd + 2)) + src_vert[x] + src_vert[im_stride + x];
      assert(0 <= sum && sum < (1 << (bd + 4)));
      const int16_t res =
          ROUND_POWER_OF_TWO(sum, 2) - ((1 << bd) + (1 << (bd - 1)));
      dst[x] = clip_pixel(res);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}